

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring64_bitmap_remove_bulk
               (roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  _Bool _Var1;
  uint16_t uVar2;
  int iVar3;
  art_t *art_00;
  art_t *erased_val;
  art_val_t *paVar4;
  undefined4 *in_RSI;
  leaf_t *leaf_1;
  _Bool erased;
  leaf_t leaf;
  container_t *container2;
  uint8_t typecode2;
  container_t *container;
  uint8_t typecode;
  uint16_t low16;
  uint8_t high48 [6];
  art_t *art;
  undefined7 in_stack_ffffffffffffff98;
  uint8_t in_stack_ffffffffffffff9f;
  roaring64_bitmap_t *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  roaring64_bitmap_t *in_stack_ffffffffffffffb0;
  leaf_t *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  uint16_t low16_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 in_stack_ffffffffffffffda;
  undefined2 in_stack_ffffffffffffffde;
  
  low16_00 = (uint16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x30);
  uVar2 = split_key((uint64_t)in_stack_ffffffffffffffa0,
                    (uint8_t *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  if ((*(long *)(in_RSI + 2) == 0) ||
     (iVar3 = compare_high48((art_key_chunk_t *)in_stack_ffffffffffffffa0,
                             (art_key_chunk_t *)
                             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
     iVar3 != 0)) {
    paVar4 = art_find((art_t *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                      (art_key_chunk_t *)0x13dade);
    containerptr_roaring64_bitmap_remove
              ((roaring64_bitmap_t *)
               CONCAT26(in_stack_ffffffffffffffde,CONCAT42(in_stack_ffffffffffffffda,uVar2)),
               (uint8_t *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),low16_00,
               in_stack_ffffffffffffffc0);
    *(art_val_t **)(in_RSI + 2) = paVar4;
    *in_RSI = in_stack_ffffffffffffffda;
    *(undefined2 *)(in_RSI + 1) = in_stack_ffffffffffffffde;
  }
  else {
    get_typecode(**(leaf_t **)(in_RSI + 2));
    art_00 = (art_t *)get_container(in_stack_ffffffffffffffa0,
                                    CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    erased_val = (art_t *)container_remove((container_t *)
                                           CONCAT17(in_stack_ffffffffffffffaf,
                                                    in_stack_ffffffffffffffa8),
                                           (uint16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x30),
                                           (uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x28),
                                           (uint8_t *)
                                           CONCAT17(in_stack_ffffffffffffff9f,
                                                    in_stack_ffffffffffffff98));
    if (erased_val != art_00) {
      container_free(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
      replace_container(in_stack_ffffffffffffffb0,
                        (leaf_t *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
    }
    _Var1 = container_nonzero_cardinality
                      ((container_t *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                       '\0');
    if (!_Var1) {
      container_free(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
      art_erase(art_00,(art_key_chunk_t *)in_stack_ffffffffffffffc0,&erased_val->root);
      remove_container(in_stack_ffffffffffffffa0,
                       CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_remove_bulk(roaring64_bitmap_t *r,
                                  roaring64_bulk_context_t *context,
                                  uint64_t val) {
    art_t *art = &r->art;
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    if (context->leaf != NULL &&
        compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode = get_typecode(*context->leaf);
        container_t *container = get_container(r, *context->leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_remove(container, low16, typecode, &typecode2);
        if (container2 != container) {
            container_free(container, typecode);
            replace_container(r, context->leaf, container2, typecode2);
        }
        if (!container_nonzero_cardinality(container2, typecode2)) {
            container_free(container2, typecode2);
            leaf_t leaf;
            bool erased = art_erase(art, high48, (art_val_t *)&leaf);
            assert(erased);
            remove_container(r, leaf);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf_t *leaf = (leaf_t *)art_find(art, high48);
        containerptr_roaring64_bitmap_remove(r, high48, low16, leaf);
        context->leaf = leaf;
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}